

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O0

void __thiscall
duckdb::AggregateFunction::AggregateFunction
          (AggregateFunction *this,vector<duckdb::LogicalType,_true> *arguments,
          LogicalType *return_type,aggregate_size_t state_size,aggregate_initialize_t initialize,
          aggregate_update_t update,aggregate_combine_t combine,aggregate_finalize_t finalize,
          aggregate_simple_update_t simple_update,bind_aggregate_function_t bind,
          aggregate_destructor_t destructor,aggregate_statistics_t statistics,
          aggregate_window_t window,aggregate_serialize_t serialize,
          aggregate_deserialize_t deserialize)

{
  aggregate_update_t in_RCX;
  aggregate_combine_t in_RDX;
  aggregate_simple_update_t unaff_RBX;
  aggregate_serialize_t unaff_RBP;
  aggregate_finalize_t in_RSI;
  FunctionNullHandling in_DIL;
  AggregateFunction *in_R9;
  bind_aggregate_function_t unaff_R12;
  aggregate_destructor_t unaff_R13;
  aggregate_statistics_t unaff_R14;
  aggregate_window_t unaff_R15;
  aggregate_deserialize_t unaff_retaddr;
  undefined8 in_stack_00000048;
  undefined1 local_118 [24];
  undefined4 local_100;
  undefined8 local_c8;
  string *local_b0;
  undefined1 *local_a8;
  aggregate_initialize_t in_stack_ffffffffffffff78;
  aggregate_size_t in_stack_ffffffffffffff80;
  LogicalType *in_stack_ffffffffffffff88;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  
  local_b0 = (string *)&stack0xffffffffffffff80;
  std::__cxx11::string::string(local_b0);
  local_c8 = in_stack_00000048;
  local_100 = 0;
  local_a8 = local_118;
  AggregateFunction(in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                    in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                    in_RCX,in_RDX,in_RSI,in_DIL,unaff_RBX,unaff_R12,unaff_R13,unaff_R14,unaff_R15,
                    unaff_RBP,unaff_retaddr);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  return;
}

Assistant:

AggregateFunction(const vector<LogicalType> &arguments, const LogicalType &return_type, aggregate_size_t state_size,
	                  aggregate_initialize_t initialize, aggregate_update_t update, aggregate_combine_t combine,
	                  aggregate_finalize_t finalize, aggregate_simple_update_t simple_update = nullptr,
	                  bind_aggregate_function_t bind = nullptr, aggregate_destructor_t destructor = nullptr,
	                  aggregate_statistics_t statistics = nullptr, aggregate_window_t window = nullptr,
	                  aggregate_serialize_t serialize = nullptr, aggregate_deserialize_t deserialize = nullptr)
	    : AggregateFunction(string(), arguments, return_type, state_size, initialize, update, combine, finalize,
	                        FunctionNullHandling::DEFAULT_NULL_HANDLING, simple_update, bind, destructor, statistics,
	                        window, serialize, deserialize) {
	}